

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx::OrientedDiscMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [16];
  float fVar47;
  undefined1 auVar44 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [64];
  undefined1 auVar55 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  Primitive *local_280;
  undefined8 uStack_278;
  RTCFilterFunctionNArguments local_270;
  undefined1 local_240 [16];
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar9 = context->scene;
  uVar27 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar10->time_range).lower;
  fVar1 = pGVar10->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar10->time_range).upper - fVar1));
  auVar28 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar28 = vminss_avx(auVar28,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar14 = vmaxss_avx(ZEXT816(0) << 0x20,auVar28);
  iVar21 = (int)auVar14._0_4_;
  lVar11 = *(long *)&pGVar10[2].numPrimitives;
  lVar26 = (long)iVar21 * 0x38;
  lVar12 = *(long *)(lVar11 + 0x10 + lVar26);
  lVar25 = *(long *)(lVar11 + lVar26);
  auVar28 = *(undefined1 (*) [16])(lVar25 + lVar12 * uVar27);
  uVar24 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar37 = *(undefined1 (*) [16])(lVar25 + lVar12 * uVar24);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar29 = *(undefined1 (*) [16])(lVar25 + lVar12 * uVar22);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar34 = *(undefined1 (*) [16])(lVar25 + lVar12 * uVar23);
  p_Var13 = pGVar10[2].intersectionFilterN;
  lVar12 = *(long *)(p_Var13 + lVar26);
  lVar25 = *(long *)(p_Var13 + lVar26 + 0x10);
  auVar35 = *(undefined1 (*) [16])(lVar12 + lVar25 * uVar27);
  auVar30 = *(undefined1 (*) [16])(lVar12 + lVar25 * uVar24);
  auVar31 = *(undefined1 (*) [16])(lVar12 + lVar25 * uVar22);
  auVar39 = *(undefined1 (*) [16])(lVar12 + lVar25 * uVar23);
  lVar25 = (long)(iVar21 + 1) * 0x38;
  lVar12 = *(long *)(lVar11 + lVar25);
  lVar11 = *(long *)(lVar11 + 0x10 + lVar25);
  auVar43 = *(undefined1 (*) [16])(lVar12 + lVar11 * uVar27);
  auVar41 = *(undefined1 (*) [16])(lVar12 + lVar11 * uVar24);
  auVar48 = *(undefined1 (*) [16])(lVar12 + lVar11 * uVar22);
  auVar55 = *(undefined1 (*) [16])(lVar12 + lVar11 * uVar23);
  lVar11 = *(long *)(p_Var13 + lVar25);
  lVar12 = *(long *)(p_Var13 + lVar25 + 0x10);
  auVar36 = *(undefined1 (*) [16])(lVar11 + uVar27 * lVar12);
  auVar40 = *(undefined1 (*) [16])(lVar11 + uVar24 * lVar12);
  fVar1 = fVar1 - auVar14._0_4_;
  auVar16 = vunpcklps_avx(auVar28,auVar29);
  auVar14 = vunpckhps_avx(auVar28,auVar29);
  auVar28 = vunpcklps_avx(auVar37,auVar34);
  auVar15 = vunpckhps_avx(auVar37,auVar34);
  auVar17 = vunpcklps_avx(auVar16,auVar28);
  auVar29 = vunpckhps_avx(auVar16,auVar28);
  auVar16 = vunpcklps_avx(auVar35,auVar31);
  auVar37 = vunpckhps_avx(auVar35,auVar31);
  auVar35 = vunpcklps_avx(auVar30,auVar39);
  auVar34 = vunpckhps_avx(auVar30,auVar39);
  auVar28 = *(undefined1 (*) [16])(lVar11 + uVar22 * lVar12);
  auVar18 = vunpcklps_avx(auVar37,auVar34);
  auVar19 = vunpcklps_avx(auVar16,auVar35);
  auVar34 = vunpckhps_avx(auVar16,auVar35);
  auVar37 = vunpcklps_avx(auVar43,auVar48);
  auVar30 = vunpckhps_avx(auVar43,auVar48);
  auVar35 = vunpcklps_avx(auVar41,auVar55);
  auVar31 = vunpckhps_avx(auVar41,auVar55);
  auVar43 = vunpcklps_avx(auVar37,auVar35);
  auVar35 = vunpckhps_avx(auVar37,auVar35);
  auVar39 = vunpcklps_avx(auVar36,auVar28);
  auVar37 = vunpckhps_avx(auVar36,auVar28);
  auVar28 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar23);
  auVar41 = vunpcklps_avx(auVar40,auVar28);
  auVar28 = vunpckhps_avx(auVar40,auVar28);
  auVar48 = vunpcklps_avx(auVar37,auVar28);
  auVar55 = vunpcklps_avx(auVar39,auVar41);
  auVar39 = vunpckhps_avx(auVar39,auVar41);
  auVar28 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar37 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  fVar50 = auVar28._0_4_;
  fVar52 = auVar28._4_4_;
  fVar53 = auVar28._8_4_;
  fVar54 = auVar28._12_4_;
  fVar42 = auVar37._0_4_;
  fVar45 = auVar37._4_4_;
  fVar46 = auVar37._8_4_;
  fVar47 = auVar37._12_4_;
  auVar41._0_4_ = fVar50 * auVar43._0_4_ + fVar42 * auVar17._0_4_;
  auVar41._4_4_ = fVar52 * auVar43._4_4_ + fVar45 * auVar17._4_4_;
  auVar41._8_4_ = fVar53 * auVar43._8_4_ + fVar46 * auVar17._8_4_;
  auVar41._12_4_ = fVar54 * auVar43._12_4_ + fVar47 * auVar17._12_4_;
  local_200._0_4_ = fVar42 * auVar29._0_4_ + fVar50 * auVar35._0_4_;
  local_200._4_4_ = fVar45 * auVar29._4_4_ + fVar52 * auVar35._4_4_;
  local_200._8_4_ = fVar46 * auVar29._8_4_ + fVar53 * auVar35._8_4_;
  local_200._12_4_ = fVar47 * auVar29._12_4_ + fVar54 * auVar35._12_4_;
  local_290._0_4_ = auVar19._0_4_;
  local_290._4_4_ = auVar19._4_4_;
  fStack_288 = auVar19._8_4_;
  fStack_284 = auVar19._12_4_;
  local_210 = fVar42 * (float)local_290._0_4_ + fVar50 * auVar55._0_4_;
  fStack_20c = fVar45 * (float)local_290._4_4_ + fVar52 * auVar55._4_4_;
  fStack_208 = fVar46 * fStack_288 + fVar53 * auVar55._8_4_;
  fStack_204 = fVar47 * fStack_284 + fVar54 * auVar55._12_4_;
  local_2c0._0_4_ = auVar34._0_4_;
  local_2c0._4_4_ = auVar34._4_4_;
  fStack_2b8 = auVar34._8_4_;
  fStack_2b4 = auVar34._12_4_;
  local_220 = fVar42 * (float)local_2c0._0_4_ + fVar50 * auVar39._0_4_;
  fStack_21c = fVar45 * (float)local_2c0._4_4_ + fVar52 * auVar39._4_4_;
  fStack_218 = fVar46 * fStack_2b8 + fVar53 * auVar39._8_4_;
  fStack_214 = fVar47 * fStack_2b4 + fVar54 * auVar39._12_4_;
  local_310 = auVar18._0_4_;
  fStack_30c = auVar18._4_4_;
  fStack_308 = auVar18._8_4_;
  fStack_304 = auVar18._12_4_;
  local_230 = fVar42 * local_310 + fVar50 * auVar48._0_4_;
  fStack_22c = fVar45 * fStack_30c + fVar52 * auVar48._4_4_;
  fStack_228 = fVar46 * fStack_308 + fVar53 * auVar48._8_4_;
  fStack_224 = fVar47 * fStack_304 + fVar54 * auVar48._12_4_;
  local_1f0 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar28._0_4_ = fVar1 * local_210 + local_220 * fVar2 + fVar3 * local_230;
  auVar28._4_4_ = fVar1 * fStack_20c + fStack_21c * fVar2 + fVar3 * fStack_22c;
  auVar28._8_4_ = fVar1 * fStack_208 + fStack_218 * fVar2 + fVar3 * fStack_228;
  auVar28._12_4_ = fVar1 * fStack_204 + fStack_214 * fVar2 + fVar3 * fStack_224;
  auVar37 = vcmpps_avx(auVar28,ZEXT416(0) << 0x20,4);
  auVar34._8_4_ = 0x3f800000;
  auVar34._0_8_ = 0x3f8000003f800000;
  auVar34._12_4_ = 0x3f800000;
  auVar28 = vblendvps_avx(auVar34,auVar28,auVar37);
  auVar29 = vunpcklps_avx(auVar30,auVar31);
  auVar34 = vunpcklps_avx(auVar14,auVar15);
  auVar55._0_4_ = fVar42 * auVar34._0_4_ + fVar50 * auVar29._0_4_;
  auVar55._4_4_ = fVar45 * auVar34._4_4_ + fVar52 * auVar29._4_4_;
  auVar55._8_4_ = fVar46 * auVar34._8_4_ + fVar53 * auVar29._8_4_;
  auVar55._12_4_ = fVar47 * auVar34._12_4_ + fVar54 * auVar29._12_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x40);
  auVar29._4_4_ = fVar4;
  auVar29._0_4_ = fVar4;
  auVar29._8_4_ = fVar4;
  auVar29._12_4_ = fVar4;
  auVar29 = vsubps_avx(auVar55,auVar29);
  fVar5 = *(float *)(ray + k * 4 + 0x20);
  auVar35._4_4_ = fVar5;
  auVar35._0_4_ = fVar5;
  auVar35._8_4_ = fVar5;
  auVar35._12_4_ = fVar5;
  auVar34 = vsubps_avx(local_200,auVar35);
  fVar6 = *(float *)(ray + k * 4);
  auVar39._4_4_ = fVar6;
  auVar39._0_4_ = fVar6;
  auVar39._8_4_ = fVar6;
  auVar39._12_4_ = fVar6;
  auVar35 = vsubps_avx(auVar41,auVar39);
  auVar48._0_4_ = auVar35._0_4_ * local_210 + local_220 * auVar34._0_4_ + local_230 * auVar29._0_4_;
  auVar48._4_4_ =
       auVar35._4_4_ * fStack_20c + fStack_21c * auVar34._4_4_ + fStack_22c * auVar29._4_4_;
  auVar48._8_4_ =
       auVar35._8_4_ * fStack_208 + fStack_218 * auVar34._8_4_ + fStack_228 * auVar29._8_4_;
  auVar48._12_4_ =
       auVar35._12_4_ * fStack_204 + fStack_214 * auVar34._12_4_ + fStack_224 * auVar29._12_4_;
  local_1c0 = vdivps_avx(auVar48,auVar28);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar43._4_4_ = uVar7;
  auVar43._0_4_ = uVar7;
  auVar43._8_4_ = uVar7;
  auVar43._12_4_ = uVar7;
  auVar28 = vcmpps_avx(auVar43,local_1c0,2);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_240._4_4_ = uVar7;
  local_240._0_4_ = uVar7;
  local_240._8_4_ = uVar7;
  local_240._12_4_ = uVar7;
  auVar29 = vcmpps_avx(local_1c0,local_240,2);
  auVar28 = vandps_avx(auVar29,auVar28);
  auVar29 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar29 = vpcmpgtd_avx(auVar29,_DAT_01f7fcf0);
  auVar28 = vandps_avx(auVar29,auVar28);
  auVar29 = auVar37 & auVar28;
  if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0') {
    auVar28 = vandps_avx(auVar28,auVar37);
    auVar37 = vunpckhps_avx(auVar14,auVar15);
    auVar29 = vunpckhps_avx(auVar30,auVar31);
    fVar42 = fVar50 * auVar29._0_4_ + fVar42 * auVar37._0_4_;
    fVar45 = fVar52 * auVar29._4_4_ + fVar45 * auVar37._4_4_;
    fVar46 = fVar53 * auVar29._8_4_ + fVar46 * auVar37._8_4_;
    fVar47 = fVar54 * auVar29._12_4_ + fVar47 * auVar37._12_4_;
    fVar50 = local_1c0._0_4_;
    fVar52 = local_1c0._4_4_;
    fVar53 = local_1c0._8_4_;
    fVar54 = local_1c0._12_4_;
    auVar40._0_4_ = fVar1 * fVar50 + fVar6;
    auVar40._4_4_ = fVar1 * fVar52 + fVar6;
    auVar40._8_4_ = fVar1 * fVar53 + fVar6;
    auVar40._12_4_ = fVar1 * fVar54 + fVar6;
    auVar36._0_4_ = fVar2 * fVar50 + fVar5;
    auVar36._4_4_ = fVar2 * fVar52 + fVar5;
    auVar36._8_4_ = fVar2 * fVar53 + fVar5;
    auVar36._12_4_ = fVar2 * fVar54 + fVar5;
    auVar30._0_4_ = fVar3 * fVar50 + fVar4;
    auVar30._4_4_ = fVar3 * fVar52 + fVar4;
    auVar30._8_4_ = fVar3 * fVar53 + fVar4;
    auVar30._12_4_ = fVar3 * fVar54 + fVar4;
    auVar37 = vsubps_avx(auVar40,auVar41);
    auVar29 = vsubps_avx(auVar36,local_200);
    auVar34 = vsubps_avx(auVar30,auVar55);
    auVar31._0_4_ =
         auVar37._0_4_ * auVar37._0_4_ +
         auVar29._0_4_ * auVar29._0_4_ + auVar34._0_4_ * auVar34._0_4_;
    auVar31._4_4_ =
         auVar37._4_4_ * auVar37._4_4_ +
         auVar29._4_4_ * auVar29._4_4_ + auVar34._4_4_ * auVar34._4_4_;
    auVar31._8_4_ =
         auVar37._8_4_ * auVar37._8_4_ +
         auVar29._8_4_ * auVar29._8_4_ + auVar34._8_4_ * auVar34._8_4_;
    auVar31._12_4_ =
         auVar37._12_4_ * auVar37._12_4_ +
         auVar29._12_4_ * auVar29._12_4_ + auVar34._12_4_ * auVar34._12_4_;
    auVar37._0_4_ = fVar42 * fVar42;
    auVar37._4_4_ = fVar45 * fVar45;
    auVar37._8_4_ = fVar46 * fVar46;
    auVar37._12_4_ = fVar47 * fVar47;
    auVar37 = vcmpps_avx(auVar31,auVar37,1);
    auVar28 = vandps_avx(auVar37,auVar28);
    iVar21 = vmovmskps_avx(auVar28);
    if (iVar21 != 0) {
      uStack_278 = auVar15._8_8_;
      local_280 = Disc;
      auVar44 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_1e0 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_1b0 = CONCAT44(fStack_20c,local_210);
      uStack_1a8 = CONCAT44(fStack_204,fStack_208);
      local_1a0 = CONCAT44(fStack_21c,local_220);
      uStack_198 = CONCAT44(fStack_214,fStack_218);
      local_190 = CONCAT44(fStack_22c,local_230);
      uStack_188 = CONCAT44(fStack_224,fStack_228);
      uVar27 = (ulong)(byte)iVar21;
      uVar20 = 1 << ((byte)k & 0x1f);
      auVar49 = ZEXT464(0) << 0x20;
      auVar51 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      _local_290 = auVar41;
      do {
        local_270.hit = (RTCHitN *)&local_180;
        local_270.valid = (int *)local_2e0;
        uVar22 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar8 = *(uint *)(local_1f0 + uVar22 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar8].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_1e0 + uVar22 * 4);
          local_100 = *(undefined4 *)(local_1e0 + uVar22 * 4 + 0x10);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar22 * 4);
          local_270.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar8),0);
          local_e0 = *(undefined4 *)((long)local_280 + 0x10 + uVar22 * 4);
          local_180 = *(undefined4 *)((long)&local_1b0 + uVar22 * 4);
          uVar7 = *(undefined4 *)((long)&local_1a0 + uVar22 * 4);
          local_160._4_4_ = uVar7;
          local_160._0_4_ = uVar7;
          local_160._8_4_ = uVar7;
          local_160._12_4_ = uVar7;
          local_160._16_4_ = uVar7;
          local_160._20_4_ = uVar7;
          local_160._24_4_ = uVar7;
          local_160._28_4_ = uVar7;
          uVar7 = *(undefined4 *)((long)&local_190 + uVar22 * 4);
          local_140._4_4_ = uVar7;
          local_140._0_4_ = uVar7;
          local_140._8_4_ = uVar7;
          local_140._12_4_ = uVar7;
          local_140._16_4_ = uVar7;
          local_140._20_4_ = uVar7;
          local_140._24_4_ = uVar7;
          local_140._28_4_ = uVar7;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          _local_2c0 = vcmpps_avx(auVar44._0_32_,auVar44._0_32_,0xf);
          uStack_9c = (local_270.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_270.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar20 & 0xf) << 4));
          local_2d0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar20 >> 4) * 0x10);
          local_270.geometryUserPtr = pGVar10->userPtr;
          local_270.N = 8;
          local_270.ray = (RTCRayN *)ray;
          if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar10->occlusionFilterN)(&local_270);
            auVar51 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar28 = vpcmpeqd_avx(auVar49._0_16_,local_2e0);
          auVar37 = vpcmpeqd_avx(auVar49._0_16_,local_2d0);
          auVar38._16_16_ = auVar37;
          auVar38._0_16_ = auVar28;
          auVar38 = _local_2c0 & ~auVar38;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar38 >> 0x7f,0) == '\0') &&
                (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar38 >> 0xbf,0) == '\0') &&
              (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar38[0x1f]) {
            auVar32._0_4_ = auVar28._0_4_ ^ local_2c0._0_4_;
            auVar32._4_4_ = auVar28._4_4_ ^ local_2c0._4_4_;
            auVar32._8_4_ = auVar28._8_4_ ^ local_2c0._8_4_;
            auVar32._12_4_ = auVar28._12_4_ ^ local_2c0._12_4_;
            auVar32._16_4_ = auVar37._0_4_ ^ local_2c0._16_4_;
            auVar32._20_4_ = auVar37._4_4_ ^ local_2c0._20_4_;
            auVar32._24_4_ = auVar37._8_4_ ^ local_2c0._24_4_;
            auVar32._28_4_ = auVar37._12_4_ ^ local_2c0._28_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_270);
              auVar51 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar28 = vpcmpeqd_avx(auVar49._0_16_,local_2e0);
            auVar37 = vpcmpeqd_avx(auVar49._0_16_,local_2d0);
            auVar33._16_16_ = auVar37;
            auVar33._0_16_ = auVar28;
            auVar32._0_4_ = auVar28._0_4_ ^ local_2c0._0_4_;
            auVar32._4_4_ = auVar28._4_4_ ^ local_2c0._4_4_;
            auVar32._8_4_ = auVar28._8_4_ ^ local_2c0._8_4_;
            auVar32._12_4_ = auVar28._12_4_ ^ local_2c0._12_4_;
            auVar32._16_4_ = auVar37._0_4_ ^ local_2c0._16_4_;
            auVar32._20_4_ = auVar37._4_4_ ^ local_2c0._20_4_;
            auVar32._24_4_ = auVar37._8_4_ ^ local_2c0._24_4_;
            auVar32._28_4_ = auVar37._12_4_ ^ local_2c0._28_4_;
            auVar38 = vblendvps_avx(auVar51._0_32_,*(undefined1 (*) [32])(local_270.ray + 0x100),
                                    auVar33);
            *(undefined1 (*) [32])(local_270.ray + 0x100) = auVar38;
          }
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar32 >> 0x7f,0) != '\0') ||
                (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0xbf,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar32[0x1f] < '\0') {
            return true;
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = local_240._0_4_;
        }
        uVar27 = uVar27 ^ 1L << (uVar22 & 0x3f);
      } while (uVar27 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }